

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

float * vera::skyEquirectangular(SkyData *_sky,size_t _width,size_t _height)

{
  double theta;
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  float *pfVar5;
  ArHosekSkyModelState *state;
  ArHosekSkyModelState *state_00;
  ArHosekSkyModelState *state_01;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int y;
  size_t sVar9;
  int x;
  size_t sVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar20;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar21;
  double elevation;
  col_type cVar22;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 local_e8;
  long local_a8;
  row_type local_68;
  mat<3,_3,_float,_(glm::qualifier)0> local_58;
  
  uVar4 = _width * 0x300000000 * _height;
  uVar8 = 0xffffffffffffffff;
  if (-1 < (long)uVar4) {
    uVar8 = uVar4 >> 0x1e;
  }
  pfVar5 = (float *)operator_new__(uVar8);
  elevation = (double)_sky->elevation;
  state = arhosek_xyz_skymodelstate_alloc_init
                    ((double)_sky->turbidity,(double)(_sky->groundAlbedo).field_0.x,elevation);
  state_00 = arhosek_xyz_skymodelstate_alloc_init
                       ((double)_sky->turbidity,(double)(_sky->groundAlbedo).field_1.y,elevation);
  state_01 = arhosek_xyz_skymodelstate_alloc_init
                       ((double)_sky->turbidity,(double)(_sky->groundAlbedo).field_2.z,elevation);
  local_58.value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x404f639a;
  local_58.value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf7821d1;
  local_58.value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x3d63ea55;
  local_58.value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbfc4c0f4;
  local_58.value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3ff0211f;
  local_58.value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0xbe50ec2a;
  local_58.value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbeff3f82;
  local_58.value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3d2a36a0;
  local_58.value[2].field_2.z = 1.0572252;
  local_e8.y = 1e-05;
  local_a8 = 0;
  for (sVar9 = 0; sVar9 != _height; sVar9 = sVar9 + 1) {
    fVar19 = (((float)(int)sVar9 + 0.5) / (float)_height) * 3.1415927;
    theta = (double)fVar19;
    if (theta <= 1.5707963267948966) {
      lVar12 = local_a8;
      for (sVar10 = 0; _width != sVar10; sVar10 = sVar10 + 1) {
        fVar16 = _sky->azimuth;
        fVar14 = sinf(fVar19);
        fVar15 = sinf((float)(1.5707963267948966 - elevation));
        fVar16 = cosf(0.0 - (fVar16 + (((float)(int)sVar10 + 0.5) / (float)_width) * -6.2831855 +
                                      3.1415927));
        fVar17 = cosf(fVar19);
        fVar18 = cosf((float)(1.5707963267948966 - elevation));
        fVar16 = acosf(fVar18 * fVar17 + fVar16 * fVar15 * fVar14);
        dVar3 = (double)fVar16;
        dVar1 = arhosek_tristim_skymodel_radiance(state,theta,dVar3,0);
        dVar2 = arhosek_tristim_skymodel_radiance(state_00,theta,dVar3,1);
        dVar3 = arhosek_tristim_skymodel_radiance(state_01,theta,dVar3,2);
        aVar20.y = (float)dVar2 * 0.018398786;
        local_68.field_1.y = aVar20.y;
        local_68.field_0.x = (float)dVar1 * 0.018398786;
        local_68.field_2.z = (float)dVar3 * 0.018398786;
        if (aVar20.y <= local_e8.y) {
          aVar20 = local_e8;
        }
        cVar22 = glm::operator*(&local_58,&local_68);
        lVar6 = lVar12 >> 0x1e;
        *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)((long)pfVar5 + lVar6) =
             cVar22.field_0;
        *(anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)
         ((long)pfVar5 + lVar6 + 4) = cVar22.field_1;
        *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
         ((long)pfVar5 + lVar6 + 8) = cVar22.field_2;
        lVar12 = lVar12 + 0x300000000;
        local_e8 = aVar20;
      }
    }
    local_a8 = local_a8 + _width * 0x300000000;
  }
  arhosekskymodelstate_free(state);
  arhosekskymodelstate_free(state_00);
  arhosekskymodelstate_free(state_01);
  fVar19 = 1.0 / local_e8.y;
  iVar7 = 0;
  for (uVar8 = 0; sVar9 = _width, iVar11 = iVar7, uVar8 != _height; uVar8 = uVar8 + 1) {
    while (bVar13 = sVar9 != 0, sVar9 = sVar9 - 1, bVar13) {
      if (uVar8 < _height >> 1) {
        *(ulong *)(pfVar5 + iVar11) =
             CONCAT44((float)((ulong)*(undefined8 *)(pfVar5 + iVar11) >> 0x20) * fVar19,
                      (float)*(undefined8 *)(pfVar5 + iVar11) * fVar19);
        aVar21.z = pfVar5[(long)iVar11 + 2] * fVar19;
      }
      else {
        aVar20 = (_sky->groundAlbedo).field_1;
        (pfVar5 + iVar11)[0] = (float)(_sky->groundAlbedo).field_0;
        (pfVar5 + iVar11)[1] = (float)aVar20;
        aVar21 = (_sky->groundAlbedo).field_2;
      }
      ((anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(pfVar5 + (long)iVar11 + 2)
      )->z = (float)aVar21;
      iVar11 = iVar11 + 3;
    }
    iVar7 = iVar7 + (int)_width * 3;
  }
  return pfVar5;
}

Assistant:

float* skyEquirectangular(SkyData* _sky, size_t _width, size_t _height) {
    int nPixels = _width * _height * 3;
    float *data = new float[nPixels]; 

    // FILAMENT SKYGEN 
    // https://github.com/google/filament/blob/master/tools/skygen/src/main.cpp
    //
    float solarElevation = _sky->elevation;
    float sunTheta = float(HALF_PI - solarElevation);
    float sunPhi = 0.0f;
    bool normalize = true;

    ArHosekSkyModelState* skyState[9] = {
        arhosek_xyz_skymodelstate_alloc_init(_sky->turbidity, _sky->groundAlbedo.r, solarElevation),
        arhosek_xyz_skymodelstate_alloc_init(_sky->turbidity, _sky->groundAlbedo.g, solarElevation),
        arhosek_xyz_skymodelstate_alloc_init(_sky->turbidity, _sky->groundAlbedo.b, solarElevation)
    };

    glm::mat3 XYZ_sRGB = glm::mat3(
            3.2404542f, -0.9692660f,  0.0556434f,
            -1.5371385f,  1.8760108f, -0.2040259f,
            -0.4985314f,  0.0415560f,  1.0572252f
    );

    float maxSample = 0.00001f;
    for (int y = 0; y < _height; y++) {
        float v = (y + 0.5f) / _height;
        float theta = float(M_PI * v);

        if (theta > HALF_PI) 
            continue;
            
        for (int x = 0; x < _width; x++) {
            float u = (x + 0.5f) / _width;
            float phi = float(-2.0 * M_PI * u + M_PI + _sky->azimuth);
            float gamma = angleBetween(theta, phi, sunTheta, sunPhi);

            glm::vec3 sample = glm::vec3(
                arhosek_tristim_skymodel_radiance(skyState[0], theta, gamma, 0),
                arhosek_tristim_skymodel_radiance(skyState[1], theta, gamma, 1),
                arhosek_tristim_skymodel_radiance(skyState[2], theta, gamma, 2)
            );

            if (normalize)
                sample *= float(4.0 * M_PI / 683.0);

            maxSample = std::max(maxSample, sample.y);
            sample = XYZ_sRGB * sample;

            int index = (y * _width * 3) + x * 3;
            data[index] = sample.r;
            data[index + 1] = sample.g;
            data[index + 2] = sample.b;
        }
    }

    // cleanup sky data
    arhosekskymodelstate_free(skyState[0]);
    arhosekskymodelstate_free(skyState[1]);
    arhosekskymodelstate_free(skyState[2]);

    float hdrScale = 1.0f / (normalize ? maxSample : maxSample / 16.0f);

    for (int y = 0; y < _height; y++) {
        for (int x = 0; x < _width; x++) {
            int i = (y * _width) + x;
            i *= 3;

            if (y >= _height / 2) {
                data[i + 0] = _sky->groundAlbedo.r;
                data[i + 1] = _sky->groundAlbedo.g;
                data[i + 2] = _sky->groundAlbedo.b;
            }
            else {
                data[i + 0] *= hdrScale;
                data[i + 1] *= hdrScale;
                data[i + 2] *= hdrScale;
            }
        }
    }

    return data;
}